

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O3

bool vkt::geometry::compareWithFileImage
               (Context *context,ConstPixelBufferAccess *resultImage,string *testName)

{
  TestLog *pTVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string fileName;
  undefined1 local_98 [40];
  TextureLevel referenceImage;
  IVec3 local_44;
  UVec4 local_38;
  
  tcu::TextureLevel::TextureLevel(&referenceImage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "vulkan/data/geometry/",testName);
  plVar3 = (long *)std::__cxx11::string::append(local_98);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    fileName.field_2._M_allocated_capacity = *psVar4;
    fileName.field_2._8_8_ = plVar3[3];
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  }
  else {
    fileName.field_2._M_allocated_capacity = *psVar4;
    fileName._M_dataplus._M_p = (pointer)*plVar3;
  }
  fileName._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_98._0_8_ != (long)local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  tcu::ImageIO::loadPNG(&referenceImage,context->m_testCtx->m_curArchive,fileName._M_dataplus._M_p);
  pTVar1 = context->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_98,&referenceImage);
  bVar2 = tcu::fuzzyCompare(pTVar1,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_98,resultImage,0.001,COMPARE_LOG_RESULT)
  ;
  if (bVar2) {
    pTVar1 = context->m_testCtx->m_log;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_98,&referenceImage);
    local_38.m_data[0] = 1;
    local_38.m_data[1] = 1;
    local_38.m_data[2] = 1;
    local_38.m_data[3] = 1;
    local_44.m_data[0] = 2;
    local_44.m_data[1] = 2;
    local_44.m_data[2] = 2;
    bVar2 = tcu::intThresholdPositionDeviationCompare
                      (pTVar1,"ImageComparison","Image Comparison",
                       (ConstPixelBufferAccess *)local_98,resultImage,&local_38,&local_44,false,
                       COMPARE_LOG_RESULT);
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileName._M_dataplus._M_p != &fileName.field_2) {
    operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
  }
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  return bVar2;
}

Assistant:

bool compareWithFileImage (Context& context, const tcu::ConstPixelBufferAccess& resultImage, std::string testName)
{
	tcu::TextureLevel referenceImage;
	std::string fileName="vulkan/data/geometry/"+testName+".png";
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), fileName.c_str());

	if (tcu::fuzzyCompare(context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
								referenceImage.getAccess(), resultImage, 0.001f, tcu::COMPARE_LOG_RESULT))
		return tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
														referenceImage.getAccess(), resultImage, tcu::UVec4(1u, 1u, 1u, 1u), tcu::IVec3(2,2,2), false, tcu::COMPARE_LOG_RESULT);
	else
		return false;
}